

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::ingest_stream::print(ingest_stream *this)

{
  media_fragment *this_00;
  
  for (this_00 = *(media_fragment **)&this->media_fragment_;
      this_00 != *(media_fragment **)&this->field_0xd8; this_00 = this_00 + 1) {
    media_fragment::print(this_00);
  }
  return;
}

Assistant:

void ingest_stream::print() const
	{
		for (auto it = media_fragment_.begin(); it != media_fragment_.end(); it++)
		{
			it->print();
		}
	}